

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testdict.c
# Opt level: O2

uint my_rand(uint max)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = rng_state_0 * -0x61c88645;
  uVar2 = rng_state_0 * -0x3910c8a0;
  uVar3 = rng_state_1 ^ rng_state_0;
  rng_state_0 = uVar3 << 9 ^ (rng_state_0 << 0x1a | rng_state_0 >> 6) ^ uVar3;
  rng_state_1 = uVar3 << 0xd | uVar3 >> 0x13;
  return ((uVar1 >> 0x1b | uVar2) * 5) % max;
}

Assistant:

ATTRIBUTE_NO_SANITIZE_INTEGER
static unsigned
my_rand(unsigned max) {
    unsigned s0 = rng_state[0];
    unsigned s1 = rng_state[1];
    unsigned result = HASH_ROL(s0 * 0x9E3779BB, 5) * 5;

    s1 ^= s0;
    rng_state[0] = HASH_ROL(s0, 26) ^ s1 ^ (s1 << 9);
    rng_state[1] = HASH_ROL(s1, 13);

    return((result & 0xFFFFFFFF) % max);
}